

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator::
enterNode(FastInstancesIterator *this,Node **curr)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  Term *pTVar5;
  Node *this_00;
  long *plVar6;
  Node *pNVar7;
  long *in_RSI;
  undefined8 in_RDI;
  Top TVar8;
  Node **byTop;
  Node *nl_1;
  uint bindingFunctor;
  bool noAlternatives;
  Node **nl;
  TermSpec querySpec;
  TermList query;
  NodeAlgorithm currType;
  IntermediateNode *inode;
  long *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  InstMatcher *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Node *local_58;
  long *local_48;
  TermList local_30;
  int local_24;
  long *local_20;
  long *local_18;
  
  uVar3 = (uint)((ulong)in_RDI >> 0x20);
  local_20 = (long *)*in_RSI;
  local_18 = in_RSI;
  local_24 = (**(code **)(*local_20 + 0x28))();
  Kernel::TermList::TermList(&local_30);
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec::TermSpec
            ((TermSpec *)0x448dc0);
  bVar1 = SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::
          findSpecVarBinding(in_stack_ffffffffffffff70,uVar3,
                             (TermSpec *)
                             CONCAT17(in_stack_ffffffffffffff67,
                                      CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60))
                            );
  if (!bVar1) {
    Kernel::TermList::makeVar(&local_30,0);
  }
  plVar6 = local_20;
  *local_18 = 0;
  if (local_24 == 1) {
    local_48 = local_20 + 3;
    bVar1 = false;
    bVar2 = Kernel::TermList::isTerm((TermList *)0x448e39);
    if (bVar2) {
      pTVar5 = Kernel::TermList::term((TermList *)0x448e4c);
      uVar3 = Kernel::Term::functor(pTVar5);
      while( true ) {
        bVar1 = false;
        if (*local_48 != 0) {
          SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node::term
                    ((Node *)*local_48);
          bVar2 = Kernel::TermList::isTerm((TermList *)0x448e7e);
          in_stack_ffffffffffffff66 = true;
          bVar1 = (bool)in_stack_ffffffffffffff66;
          if (bVar2) {
            SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node::term
                      ((Node *)*local_48);
            pTVar5 = Kernel::TermList::term((TermList *)0x448ea2);
            uVar4 = Kernel::Term::functor(pTVar5);
            in_stack_ffffffffffffff66 = uVar4 != uVar3;
            bVar1 = (bool)in_stack_ffffffffffffff66;
          }
        }
        if (bVar1 == false) break;
        local_48 = local_48 + 1;
      }
      bVar1 = *local_48 != 0;
      if (bVar1) {
        *local_18 = *local_48;
      }
      in_stack_ffffffffffffff67 = 0;
    }
    else {
      *local_18 = *local_48;
      local_48 = plVar6 + 4;
    }
    if (*local_18 != 0) {
      Lib::Stack<unsigned_int>::push
                ((Stack<unsigned_int> *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                 (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
    if ((*local_48 != 0) && (!bVar1)) {
      Lib::Stack<void_*>::push
                ((Stack<void_*> *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                 in_stack_ffffffffffffff58);
      Lib::
      Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
      ::push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
              *)CONCAT17(in_stack_ffffffffffffff67,
                         CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
             (NodeAlgorithm)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      return true;
    }
  }
  else {
    this_00 = Lib::
              SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
              ::listLike((SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
                          *)(local_20 + 3));
    bVar1 = Kernel::TermList::isTerm((TermList *)0x448fb9);
    if (bVar1) {
      in_stack_ffffffffffffff58 = local_20;
      TVar8 = Kernel::TermList::top
                        ((TermList *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      plVar6 = (long *)(**(code **)(*in_stack_ffffffffffffff58 + 0x50))
                                 (in_stack_ffffffffffffff58,TVar8._inner._inner._0_8_,
                                  TVar8._inner._inner._content[7],0);
      if (plVar6 != (long *)0x0) {
        *local_18 = *plVar6;
      }
      local_58 = (Node *)0x0;
    }
    else {
      pNVar7 = Lib::
               SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
               ::Node::head(this_00);
      *local_18 = (long)pNVar7;
      local_58 = Lib::
                 SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
                 ::Node::tail(this_00);
    }
    if (*local_18 != 0) {
      Lib::Stack<unsigned_int>::push
                ((Stack<unsigned_int> *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                 (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
    if (local_58 != (Node *)0x0) {
      Lib::Stack<void_*>::push
                ((Stack<void_*> *)
                 CONCAT17(in_stack_ffffffffffffff67,
                          CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                 in_stack_ffffffffffffff58);
      Lib::
      Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
      ::push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
              *)CONCAT17(in_stack_ffffffffffffff67,
                         CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
             (NodeAlgorithm)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      return true;
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::enterNode(Node*& curr)
{
  ASS(!curr->isLeaf());

  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList query;
  typename InstMatcher::TermSpec querySpec;
  //here we are interested only in the top functor or the fact that the query is a variable
  //so we can discard the information about term origin
  if(_subst.findSpecVarBinding(inode->childVar, querySpec)) {
    query=querySpec.t;
  }
  else {
    query.makeVar(0);//just an arbitrary variable so that anything will match
  }

  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    ASS(*nl); //inode is not empty
    bool noAlternatives=false;
    if(query.isTerm()) {
      unsigned bindingFunctor=query.term()->functor();
      //let's skip terms that don't have the same top functor...
      while(*nl && (!(*nl)->term().isTerm() || (*nl)->term().term()->functor()!=bindingFunctor)) {
        nl++;
      }

      if(*nl) {
	//we've found the term with the same top functor
	ASS_EQ((*nl)->term().term()->functor(),bindingFunctor);
        curr=*nl;
        noAlternatives=true; //there is at most one term with each top functor
      }
    } else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=*nl;
      nl++;
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl && !noAlternatives) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    ASS(nl); //inode is not empty
    if(query.isTerm()) {
      //only term with the same top functor will be matched by a term
      Node** byTop=inode->childByTop(query.top(), false);
      if(byTop) {
	curr=*byTop;
      }
      nl=0;
    }
    else {
      ASS(query.isVar());
      //everything is matched by a variable
      curr=nl->head();
      nl=nl->tail();
    }

    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}